

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O0

QString * __thiscall QSslEllipticCurve::longName(QSslEllipticCurve *this)

{
  QTlsBackend *pQVar1;
  undefined4 *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QTlsBackend *tlsBackend;
  QString *name;
  QString *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  QString::QString((QString *)0x3964e0);
  pQVar1 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar1 != (QTlsBackend *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x120))(local_20,pQVar1,*in_RSI);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x396524);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QSslEllipticCurve::longName() const
{
    QString name;

    if (const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse())
        name = tlsBackend->longNameForId(id);

    return name;
}